

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::DiffuseAreaLight::Phi(DiffuseAreaLight *this,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  array<float,_4> aVar3;
  bool bVar4;
  Float *pFVar5;
  Point2i PVar6;
  long in_RDI;
  Float FVar7;
  undefined1 auVar8 [64];
  undefined1 auVar15 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar21 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  SampledSpectrum SVar22;
  int c;
  RGB rgb;
  int x;
  int y;
  SampledSpectrum phi;
  int in_stack_fffffffffffffed8;
  Float in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  SampledSpectrum *in_stack_fffffffffffffee8;
  SampledSpectrum *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  int iVar23;
  undefined4 in_stack_ffffffffffffff04;
  SampledWavelengths *in_stack_ffffffffffffff18;
  RGBSpectrum *in_stack_ffffffffffffff20;
  RGB *in_stack_ffffffffffffff40;
  RGBColorSpace *in_stack_ffffffffffffff48;
  RGBSpectrum *in_stack_ffffffffffffff50;
  Image *in_stack_ffffffffffffff58;
  array<pbrt::WrapMode,_2> in_stack_ffffffffffffff64;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffff6c;
  int local_58;
  RGB local_54;
  Tuple2<pbrt::Point2,_int> local_48;
  int local_40;
  Tuple2<pbrt::Point2,_int> local_3c;
  int local_34;
  undefined8 local_30;
  undefined8 local_28;
  ulong uVar14;
  
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffedc);
  bVar4 = Image::operator_cast_to_bool((Image *)(in_RDI + 0xe0));
  auVar21 = in_ZMM1._8_56_;
  auVar15 = auVar8._8_56_;
  if (bVar4) {
    local_34 = 0;
    while( true ) {
      iVar23 = local_34;
      local_3c = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 0xe0));
      FVar7 = (Float)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      auVar21 = in_ZMM1._8_56_;
      uVar14 = auVar8._8_8_;
      if (local_3c.y <= iVar23) break;
      local_40 = 0;
      while( true ) {
        iVar23 = local_40;
        local_48 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 0xe0));
        if (local_48.x <= iVar23) break;
        RGB::RGB(&local_54);
        local_58 = 0;
        while( true ) {
          auVar21 = in_ZMM1._8_56_;
          auVar15 = auVar8._8_56_;
          if (2 < local_58) break;
          in_stack_fffffffffffffef0 = (SampledSpectrum *)(in_RDI + 0xe0);
          Point2<int>::Point2((Point2<int> *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              (int)in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
          WrapMode2D::WrapMode2D
                    ((WrapMode2D *)in_stack_fffffffffffffef0,
                     (WrapMode)((ulong)in_stack_fffffffffffffee8 >> 0x20));
          FVar7 = Image::GetChannel(in_stack_ffffffffffffff58,(Point2i)in_stack_ffffffffffffff6c,
                                    (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                    (WrapMode2D)in_stack_ffffffffffffff64.values);
          pFVar5 = RGB::operator[](&local_54,local_58);
          auVar8 = ZEXT464((uint)FVar7);
          *pFVar5 = FVar7;
          local_58 = local_58 + 1;
        }
        in_stack_fffffffffffffee8 = (SampledSpectrum *)&stack0xffffffffffffff60;
        RGBSpectrum::RGBSpectrum
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        SVar22 = RGBSpectrum::Sample(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        in_ZMM1._0_8_ = SVar22.values.values._8_8_;
        in_ZMM1._8_56_ = auVar21;
        auVar8._0_8_ = SVar22.values.values._0_8_;
        auVar8._8_56_ = auVar15;
        vmovlpd_avx(auVar8._0_16_);
        vmovlpd_avx(in_ZMM1._0_16_);
        SampledSpectrum::operator+=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        local_40 = local_40 + 1;
      }
      local_34 = local_34 + 1;
    }
    PVar6 = Image::Resolution((Image *)(in_RDI + 0xe0));
    in_stack_fffffffffffffee4 = PVar6.super_Tuple2<pbrt::Point2,_int>.x;
    Image::Resolution((Image *)(in_RDI + 0xe0));
    SampledSpectrum::operator/=(in_stack_fffffffffffffef0,FVar7);
  }
  else {
    SVar22 = DenselySampledSpectrum::Sample
                       ((DenselySampledSpectrum *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        (SampledWavelengths *)
                        CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    auVar16._0_8_ = SVar22.values.values._8_8_;
    auVar16._8_56_ = auVar21;
    auVar9._0_8_ = SVar22.values.values._0_8_;
    auVar9._8_56_ = auVar15;
    uVar14 = auVar15._0_8_;
    local_30 = vmovlpd_avx(auVar9._0_16_);
    local_28 = vmovlpd_avx(auVar16._0_16_);
  }
  auVar15 = ZEXT856(uVar14);
  SVar22 = SampledSpectrum::operator*
                     ((SampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      in_stack_fffffffffffffedc);
  auVar17._0_8_ = SVar22.values.values._8_8_;
  auVar17._8_56_ = auVar21;
  auVar10._0_8_ = SVar22.values.values._0_8_;
  auVar10._8_56_ = auVar15;
  vmovlpd_avx(auVar10._0_16_);
  vmovlpd_avx(auVar17._0_16_);
  auVar15 = (undefined1  [56])0x0;
  SVar22 = SampledSpectrum::operator*
                     ((SampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      in_stack_fffffffffffffedc);
  auVar18._0_8_ = SVar22.values.values._8_8_;
  auVar18._8_56_ = auVar21;
  auVar11._0_8_ = SVar22.values.values._0_8_;
  auVar11._8_56_ = auVar15;
  vmovlpd_avx(auVar11._0_16_);
  vmovlpd_avx(auVar18._0_16_);
  auVar15 = (undefined1  [56])0x0;
  SVar22 = SampledSpectrum::operator*
                     ((SampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      in_stack_fffffffffffffedc);
  auVar19._0_8_ = SVar22.values.values._8_8_;
  auVar19._8_56_ = auVar21;
  auVar12._0_8_ = SVar22.values.values._0_8_;
  auVar12._8_56_ = auVar15;
  vmovlpd_avx(auVar12._0_16_);
  vmovlpd_avx(auVar19._0_16_);
  auVar15 = (undefined1  [56])0x0;
  SVar22 = SampledSpectrum::operator*
                     ((SampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      in_stack_fffffffffffffedc);
  auVar20._0_8_ = SVar22.values.values._8_8_;
  auVar20._8_56_ = auVar21;
  auVar13._0_8_ = SVar22.values.values._0_8_;
  auVar13._8_56_ = auVar15;
  uVar1 = vmovlpd_avx(auVar13._0_16_);
  uVar2 = vmovlpd_avx(auVar20._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

SampledSpectrum DiffuseAreaLight::Phi(const SampledWavelengths &lambda) const {
    SampledSpectrum phi(0.f);
    if (image) {
        // Compute average light image emission
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x) {
                RGB rgb;
                for (int c = 0; c < 3; ++c)
                    rgb[c] = image.GetChannel({x, y}, c);
                phi += RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
            }
        phi /= image.Resolution().x * image.Resolution().y;

    } else
        phi = Lemit.Sample(lambda);
    return phi * (twoSided ? 2 : 1) * scale * area * Pi;
}